

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall IR::Instr::CanHaveArgOutChain(Instr *this)

{
  OpCode OVar1;
  
  OVar1 = this->m_opcode;
  if (OVar1 < NewScObjectSpread) {
    if ((OVar1 - 0xc4 < 6) && ((0x29U >> (OVar1 - 0xc4 & 0x1f) & 1) != 0)) {
      return true;
    }
    if (OVar1 == CallI) {
      return true;
    }
  }
  else {
    if (OVar1 == NewScObjectSpread) {
      return true;
    }
    if (OVar1 == CallIFixed) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Instr::CanHaveArgOutChain() const
{
    return
        this->m_opcode == Js::OpCode::CallI ||
        this->m_opcode == Js::OpCode::CallIFixed ||
        this->m_opcode == Js::OpCode::NewScObject ||
        this->m_opcode == Js::OpCode::NewScObjectSpread ||
        this->m_opcode == Js::OpCode::NewScObjArray ||
        this->m_opcode == Js::OpCode::NewScObjArraySpread;
}